

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

Pla_Man_t * Pla_GenFromMinterms(char *pName,Vec_Int_t *vMints,int nVars)

{
  int iVar1;
  int iVar2;
  Pla_Man_t *p_00;
  word *pwVar3;
  Pla_Lit_t d;
  word *pCube;
  int Mint;
  int Lit;
  int k;
  int i;
  Pla_Man_t *p;
  int nVars_local;
  Vec_Int_t *vMints_local;
  char *pName_local;
  
  iVar1 = Vec_IntSize(vMints);
  p_00 = Pla_ManAlloc(pName,nVars,1,iVar1);
  for (Lit = 0; iVar1 = Pla_ManCubeNum(p_00), Lit < iVar1; Lit = Lit + 1) {
    pwVar3 = Pla_CubeIn(p_00,Lit);
    iVar1 = Vec_IntEntry(vMints,Lit);
    for (Mint = 0; iVar2 = Pla_ManInNum(p_00), Mint < iVar2; Mint = Mint + 1) {
      Pla_CubeGetLit(pwVar3,Mint);
      d = PLA_LIT_ZERO;
      if ((iVar1 >> ((byte)Mint & 0x1f) & 1U) != 0) {
        d = PLA_LIT_ONE;
      }
      Pla_CubeSetLit(pwVar3,Mint,d);
    }
  }
  for (Lit = 0; iVar1 = Pla_ManCubeNum(p_00), Lit < iVar1; Lit = Lit + 1) {
    pwVar3 = Pla_CubeOut(p_00,Lit);
    Pla_CubeSetLit(pwVar3,0,PLA_LIT_ONE);
  }
  return p_00;
}

Assistant:

Pla_Man_t * Pla_GenFromMinterms( char * pName, Vec_Int_t * vMints, int nVars )
{
    Pla_Man_t * p = Pla_ManAlloc( pName, nVars, 1, Vec_IntSize(vMints) );
    int i, k, Lit, Mint;
    word * pCube;
    Pla_ForEachCubeIn( p, pCube, i )
    {
        Mint = Vec_IntEntry(vMints, i);
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            Pla_CubeSetLit( pCube, k, ((Mint >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
    }
    Pla_ForEachCubeOut( p, pCube, i )
        Pla_CubeSetLit( pCube, 0, PLA_LIT_ONE );
    return p;
}